

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

uint prvTidyReadChar(StreamIn *in)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TidyDocImpl *doc;
  Lexer *pLVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Bool BVar7;
  uint ch;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  
  if (in->pushed == no) {
    PopLastPos(in);
    iVar5 = in->curcol;
    in->lastcols[in->curlastpos] = iVar5;
    if (in->tabs < 1) {
LAB_00153b4f:
      do {
        do {
          uVar6 = ReadCharFromStream(in);
          if (uVar6 == 0xffffffff) {
            return 0xffffffff;
          }
          if (uVar6 == 9) {
            if (*(int *)((in->doc->config).value + 0x2b) == 0) {
              uVar4 = *(uint *)((in->doc->config).value + 0x53);
              if (uVar4 == 0) {
                iVar5 = 0;
              }
              else {
                iVar5 = ~((in->curcol - 1U) % uVar4) + uVar4;
              }
              in->tabs = iVar5;
              uVar6 = 0x20;
            }
            else {
              uVar6 = 9;
            }
LAB_00153ddc:
            in->curcol = in->curcol + 1;
            return uVar6;
          }
          if (uVar6 == 0x1b) {
            return 0x1b;
          }
          if (uVar6 == 0xd) {
            uVar6 = ReadCharFromStream(in);
            if (uVar6 != 10) {
              prvTidyUngetChar(uVar6,in);
            }
LAB_00153d8c:
            in->curcol = 1;
            in->curline = in->curline + 1;
            return 10;
          }
          if (uVar6 == 10) goto LAB_00153d8c;
        } while (uVar6 < 0x20);
        uVar4 = in->encoding;
        if (uVar4 < 0xe) {
          if ((0xe00U >> (uVar4 & 0x1f) & 1) == 0) {
            if ((0x3031U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00153ddc;
          }
          else {
            BVar7 = prvTidyIsValidUTF16FromUCS4(uVar6);
            uVar10 = uVar6;
            if (BVar7 == no) {
LAB_00153c40:
              prvTidyReportEncodingError(in->doc,0x24c,uVar10,yes);
              uVar6 = 0;
            }
            else {
              BVar7 = prvTidyIsLowSurrogate(uVar6);
              if (BVar7 != no) {
                ch = ReadCharFromStream(in);
                if (ch == 0xffffffff) {
                  return 0xffffffff;
                }
                BVar7 = prvTidyIsHighSurrogate(ch);
                uVar10 = 0;
                if (BVar7 != no) {
                  uVar6 = prvTidyCombineSurrogatePair(ch,uVar6);
                  BVar7 = prvTidyIsValidCombinedChar(uVar6);
                  if (uVar6 == 0) {
                    uVar10 = 0;
                  }
                  else {
                    uVar10 = 0;
                    if (BVar7 != no) goto LAB_00153c56;
                  }
                }
                goto LAB_00153c40;
              }
            }
LAB_00153c56:
            uVar4 = in->encoding;
          }
        }
        if (uVar4 == 2) {
          if (uVar6 - 0xa0 < 0x1f) {
            uVar9 = uVar6 & 0xff;
            switch(uVar9) {
            case 0xb4:
              uVar10 = 0x17d;
              goto LAB_00153e30;
            case 0xb5:
            case 0xb6:
            case 0xb7:
            case 0xb9:
            case 0xba:
            case 0xbb:
              break;
            case 0xb8:
              uVar10 = 0x17e;
              goto LAB_00153e30;
            case 0xbc:
              uVar10 = 0x152;
              goto LAB_00153e30;
            case 0xbd:
              uVar10 = 0x153;
              goto LAB_00153e30;
            case 0xbe:
              uVar10 = 0x178;
              goto LAB_00153e30;
            default:
              if (uVar9 == 0xa4) {
                uVar10 = 0x20ac;
                goto LAB_00153e30;
              }
              if (uVar9 == 0xa6) {
                uVar10 = 0x160;
                goto LAB_00153e30;
              }
              if (uVar9 == 0xa8) {
                uVar10 = 0x161;
                goto LAB_00153e30;
              }
            }
          }
        }
        else {
          if (uVar4 == 8) {
            puVar8 = IBM2Unicode;
          }
          else {
            puVar8 = Mac2Unicode;
            if (uVar4 != 6) goto switchD_00153cbe_caseD_b5;
          }
          if ((uVar6 & 0xffffff80) == 0x80) {
            uVar6 = puVar8[uVar6 - 0x80];
          }
        }
switchD_00153cbe_caseD_b5:
        uVar10 = uVar6;
        if ((uVar6 & 0xffffffe0) == 0x80) {
          doc = in->doc;
          pLVar3 = doc->lexer;
          if (pLVar3 != (Lexer *)0x0) {
            uVar1 = in->curcol;
            uVar2 = in->curline;
            pLVar3->lines = uVar2;
            pLVar3->columns = uVar1;
          }
          puVar8 = Win2Unicode;
          if (uVar4 == 6) {
            puVar8 = Mac2Unicode;
          }
          uVar10 = puVar8[uVar6 - 0x80];
          if (((uVar4 & 0xfffffffe) == 6) && (uVar10 == 0)) {
            prvTidyReportEncodingError(doc,0x28f,uVar6,yes);
            goto LAB_00153b4f;
          }
          if ((uVar4 & 0xfffffffe) != 6) {
            prvTidyReportEncodingError(doc,0x24a,uVar6,(uint)(uVar10 == 0));
          }
        }
      } while (uVar10 == 0);
LAB_00153e30:
      in->curcol = in->curcol + 1;
    }
    else {
      in->curcol = iVar5 + 1;
      in->tabs = in->tabs + -1;
      uVar10 = 0x20;
    }
  }
  else {
    if (in->bufpos == 0) {
      __assert_fail("in->bufpos > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/streamio.c"
                    ,0x1a5,"uint PopChar(StreamIn *)");
    }
    uVar4 = in->bufpos - 1;
    in->bufpos = uVar4;
    uVar10 = in->charbuf[uVar4];
    if (uVar4 == 0) {
      in->pushed = no;
    }
    if (uVar10 == 10) {
      in->curline = in->curline + 1;
      iVar5 = 1;
    }
    else {
      iVar5 = in->curcol + 1;
    }
    in->curcol = iVar5;
    PopLastPos(in);
  }
  return uVar10;
}

Assistant:

uint TY_(ReadChar)( StreamIn *in )
{
    uint c = EndOfStream;

    if ( in->pushed )
        return PopChar( in );

    SaveLastPos( in );

    if ( in->tabs > 0 )
    {
        in->curcol++;
        in->tabs--;
        return ' ';
    }
    
    for (;;)
    {
        c = ReadCharFromStream(in);

        if ( EndOfStream == c )
            return EndOfStream;

        if (c == '\n')
        {
            in->curcol = 1;
            in->curline++;
            break;
        }

        if (c == '\t')
        {
            Bool keeptabs = cfg( in->doc, TidyKeepTabs );
            if (!keeptabs) {
                uint tabsize = cfg(in->doc, TidyTabSize);
                in->tabs = tabsize > 0 ?
                    tabsize - ((in->curcol - 1) % tabsize) - 1
                    : 0;
                c = ' ';
            }
            in->curcol++;
            break;
        }

        /* #427663 - map '\r' to '\n' - Andy Quick 11 Aug 00 */
        if (c == '\r')
        {
            c = ReadCharFromStream(in);
            if (c != '\n')
            {
                TY_(UngetChar)( c, in );
                c = '\n';
            }
            else
            {
            }
            in->curcol = 1;
            in->curline++;
            break;
        }

#ifndef NO_NATIVE_ISO2022_SUPPORT
        /* strip control characters, except for Esc */
        if (c == '\033')
            break;
#endif

        /* Form Feed is allowed in HTML */
        if ( c == '\015' && !cfgBool(in->doc, TidyXmlTags) )
            break;
            
        if ( c < 32 )
            continue; /* discard control char */

        /* watch out for chars that have already been decoded such as */
        /* IS02022, UTF-8 etc, that don't require further decoding */

        if (
            in->encoding == RAW
#ifndef NO_NATIVE_ISO2022_SUPPORT
         || in->encoding == ISO2022
#endif
         || in->encoding == UTF8
         || in->encoding == SHIFTJIS /* #431953 - RJ */
         || in->encoding == BIG5     /* #431953 - RJ */
           )
        {
            in->curcol++;
            break;
        }

        /* handle surrogate pairs */
        if ( in->encoding == UTF16LE ||
             in->encoding == UTF16   ||
             in->encoding == UTF16BE )
        {
            if ( !TY_(IsValidUTF16FromUCS4)(c) )
            {
                /* invalid UTF-16 value */
                TY_(ReportEncodingError)(in->doc, INVALID_UTF16, c, yes);
                c = 0;
            }
            else if ( TY_(IsLowSurrogate)(c) )
            {
                uint n = c;
                uint m = ReadCharFromStream( in );
                if ( m == EndOfStream )
                   return EndOfStream;

                c = 0;
                if ( TY_(IsHighSurrogate)(m) )
                {
                    n = TY_(CombineSurrogatePair)( m, n );
                    if ( TY_(IsValidCombinedChar)(n) )
                        c = n;
                }
                /* not a valid pair */
                if ( 0 == c )
                    TY_(ReportEncodingError)( in->doc, INVALID_UTF16, c, yes );
            }
        }

        /* Do first: acts on range 128 - 255 */
        switch ( in->encoding )
        {
        case MACROMAN:
            c = TY_(DecodeMacRoman)( c );
            break;
        case IBM858:
            c = DecodeIbm850( c );
            break;
        case LATIN0:
            c = DecodeLatin0( c );
            break;
        }

        /* produced e.g. as a side-effect of smart quotes in Word */
        /* but can't happen if using MACROMAN encoding */
        if ( 127 < c && c < 160 )
        {
            uint c1 = 0, replMode = DISCARDED_CHAR;
            Bool isVendorChar = ( in->encoding == WIN1252 ||
                                  in->encoding == MACROMAN );
            Bool isMacChar    = ( in->encoding == MACROMAN );
            
            /* set error position just before offending character */
            if (in->doc->lexer)
            {
                in->doc->lexer->lines = in->curline;
                in->doc->lexer->columns = in->curcol;
            }
                
            if ( isMacChar )
                c1 = TY_(DecodeMacRoman)( c );
            else
                c1 = TY_(DecodeWin1252)( c );
            if ( c1 )
                replMode = REPLACED_CHAR;
                
            if ( c1 == 0 && isVendorChar )
                TY_(ReportEncodingError)(in->doc, VENDOR_SPECIFIC_CHARS, c, replMode == DISCARDED_CHAR);
            else if ( ! isVendorChar )
                TY_(ReportEncodingError)(in->doc, INVALID_SGML_CHARS, c, replMode == DISCARDED_CHAR);
                
            c = c1;
        }

        if ( c == 0 )
            continue; /* illegal char is discarded */
        
        in->curcol++;
        break;
    }

    return c;
}